

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O3

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertConditionalConLHS<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                 *con,int i)

{
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  uint uVar1;
  int iVar2;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  int iVar3;
  VarOrConst VVar4;
  NodeRange NVar5;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  alscope;
  LinTerms lt;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> ccnew;
  QuadraticFunctionalConstraint fc;
  allocator_type local_812;
  allocator_type local_811;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  local_810;
  vector<int,_std::allocator<int>_> local_808;
  int local_7ec;
  LinTerms local_7e8;
  double local_770;
  LinTerms local_768;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> local_6f0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_620;
  undefined1 local_580 [72];
  ptr local_538;
  ulong local_530;
  QuadTerms local_508;
  QuadraticFunctionalConstraint local_3c8;
  AlgebraicExpression<mp::QuadAndLinTerms> local_1e0;
  
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this + -0x208);
  uVar1 = i >> 0x1f & *(uint *)(this + 0x2a18);
  iVar3 = uVar1 + i;
  iVar2 = uVar1 + i + 1;
  if ((int)*(uint *)(this + 0x2a18) <= iVar3) {
    *(long *)(this + 0x2a18) = (long)iVar2;
  }
  *(Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    **)(this + 0x840) = this + 0x29c8;
  *(ulong *)(this + 0x848) = CONCAT44(iVar2,iVar3);
  local_810.cvt_ =
       (FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        *)this_00;
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)local_580,
             &(con->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
              .args_.super_QuadAndLinTerms);
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&local_538,
             &(con->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
              .args_.super_QuadAndLinTerms.super_LinTerms.vars_);
  QuadTerms::QuadTerms
            (&local_508,
             &(con->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
              .args_.super_QuadAndLinTerms.super_QuadTerms);
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            (&local_1e0,(QuadAndLinTerms *)local_580,0.0);
  QuadraticFunctionalConstraint::QuadraticFunctionalConstraint(&local_3c8,&local_1e0);
  if (6 < local_1e0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_1e0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_1e0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_1e0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_1e0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_1e0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_1e0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_1e0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_1e0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_1e0.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_1e0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_1e0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_1e0.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_1e0.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_1e0.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_1e0.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_1e0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_1e0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (6 < local_508.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_508.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_508.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_508.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_508.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_508.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_508.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_508.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_508.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_508.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_508.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_508.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_530) {
    operator_delete(local_538,local_530 << 2);
  }
  if (6 < (ulong)local_580._8_8_) {
    operator_delete((void *)local_580._0_8_,local_580._8_8_ << 3);
  }
  VVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AssignResult2Args<mp::QuadraticFunctionalConstraint>(this_00,&local_3c8);
  value = VVar4.field_1;
  if (((undefined1  [16])VVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    NVar5 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::MakeFixedVar(this_00,value.c_);
    value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar5.ir_;
  }
  iVar3 = value.var_;
  if ((*(int *)(this + -0x140) - *(int *)(this + -0x150)) * 8 + *(int *)(this + -0x138) <= iVar3) {
    AutoExpand<std::vector<bool,std::allocator<bool>>>
              ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(long)iVar3,false);
  }
  local_770 = 1.0;
  __l._M_len = 1;
  __l._M_array = &local_770;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_6f0,__l,&local_811);
  __l_00._M_len = 1;
  __l_00._M_array = &local_7ec;
  local_7ec = iVar3;
  std::vector<int,_std::allocator<int>_>::vector(&local_808,__l_00,&local_812);
  LinTerms::LinTerms(&local_768,(vector<double,_std::allocator<double>_> *)&local_6f0,&local_808);
  if (local_808.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_808.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_808.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_808.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.
         super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
         .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                    _M_allocated_capacity -
                    (long)local_6f0.
                          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                          .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p);
  }
  if (local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_7e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_7e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage
    ;
    local_7e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_7e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_7e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_7e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage
    ;
  }
  if (local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_7e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_7e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    local_7e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_7e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_7e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_7e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  }
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
            (&local_620,&local_7e8,
             (AlgConRhs<_1>)
             (con->
             super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
             ).
             super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
             .args_.super_AlgConRhs<_1>.rhs_,true);
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
  ConditionalConstraint(&local_6f0,&local_620);
  if (6 < local_620.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_620.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_620.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_620.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_620.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_620.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_620.super_BasicConstraint.name_.field_2) {
    operator_delete(local_620.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_620.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if (6 < local_7e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_7e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_7e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_7e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_7e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_7e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  RedefineVariable<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
            ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
              *)this_00,
             (con->
             super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
             ).super_FunctionalConstraint.result_var_,&local_6f0);
  iVar3 = (con->
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
          ).super_FunctionalConstraint.result_var_;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            (this_00,iVar3,*(double *)(*(long *)(this + -0x1c8) + (long)iVar3 * 8),
             *(double *)(*(long *)(this + -0x1b0) + (long)iVar3 * 8),
             (Context)(con->
                      super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
                      ).super_FunctionalConstraint.ctx.value_);
  if (6 < local_6f0.
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          .
          super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_6f0.
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          .
          super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
                    .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
                    .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.
         super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
         .
         super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
         .args_.super_BasicConstraint.name_._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_6f0.
                 super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                 .
                 super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                 .args_.super_BasicConstraint + 0x10U)) {
    operator_delete(local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .args_.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .args_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.
         super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
         .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_6f0.
                 super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                 .super_FunctionalConstraint.super_BasicConstraint.name_ + 0x10U)) {
    operator_delete(local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_6f0.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                    .super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  if (6 < local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_768.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_768.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (6 < local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_3c8.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_3c8.quad_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.quad_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_3c8.quad_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_3c8.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_3c8.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_3c8.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_3c8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
    operator_delete(local_3c8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                    _M_p,local_3c8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                         _M_allocated_capacity + 1);
  }
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(&local_810);
  return;
}

Assistant:

void ConvertConditionalConLHS(
      const ConditionalConstraint< AlgebraicConstraint<Body, RhsOrRange> >& con,
      int i) {
    auto alscope = MPD( MakeAutoLinker( con, i ) );       // link from \a con
    /// Create a functional constraint from the LHS
    auto fc = MakeFunctionalConstraint(
        AlgebraicExpression{con.GetConstraint().GetArguments(), 0.0});
    auto resvar = MPD( AssignResultVar2Args(std::move(fc)) );
    if ( !MPCD(VarHasMarking(resvar) ))         // mark as expr if new
      MPD( MarkAsExpression(resvar) );
    /// resvar can be a proper variable - ModelAPI should flexibly handle this
    LinTerms lt { {1.0}, {resvar} };
    ConditionalConstraint< AlgebraicConstraint<LinTerms, RhsOrRange> >
        ccnew { { std::move(lt), con.GetConstraint().GetRhsOrRange() } };
    MPD( RedefineVariable(con.GetResultVar(), std::move(ccnew)) );  // Use new CondCon
    MPD( PropagateResultOfInitExpr(con.GetResultVar(), con.GetContext()) ); // context
  }